

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::ComplainAboutMissingTarget
          (cmExportInstallFileGenerator *this,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *exportFiles)

{
  bool bVar1;
  ostream *poVar2;
  cmExportSet *this_00;
  string *psVar3;
  string local_210;
  string_view local_1f0;
  string_view local_1e0;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *exportFiles_local;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  cmExportInstallFileGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"install(EXPORT \"");
  this_00 = cmInstallExportGenerator::GetExportSet(this->IEGen);
  psVar3 = cmExportSet::GetName_abi_cxx11_(this_00);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,"\" ...) ");
  poVar2 = std::operator<<(poVar2,"includes target \"");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,"\" which requires target \"");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,"\" ");
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(exportFiles);
  if (bVar1) {
    std::operator<<((ostream *)local_1a0,"that is not in any export set.");
  }
  else {
    poVar2 = std::operator<<((ostream *)local_1a0,
                             "that is not in this export set, but in multiple other export sets: ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,", ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0);
    cmJoin(&local_1d0,exportFiles,local_1e0,local_1f0);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
    std::operator<<(poVar2,".\n");
    std::__cxx11::string::~string((string *)&local_1d0);
    poVar2 = std::operator<<((ostream *)local_1a0,
                             "An exported target cannot depend upon another target which is exported multiple times. Consider consolidating the exports of the \""
                            );
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\" target to a single export.");
  }
  std::__cxx11::ostringstream::str();
  cmSystemTools::Error(&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void cmExportInstallFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget const* depender, cmGeneratorTarget const* dependee,
  std::vector<std::string> const& exportFiles)
{
  std::ostringstream e;
  e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
    << "\" ...) "
    << "includes target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (exportFiles.empty()) {
    e << "that is not in any export set.";
  } else {
    e << "that is not in this export set, but in multiple other export sets: "
      << cmJoin(exportFiles, ", ") << ".\n";
    e << "An exported target cannot depend upon another target which is "
         "exported multiple times. Consider consolidating the exports of the "
         "\""
      << dependee->GetName() << "\" target to a single export.";
  }
  cmSystemTools::Error(e.str());
}